

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>
               (AutoFile *os,vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>
            (os,(long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                      .super__Vector_impl_data._M_start);
  puVar2 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    AutoFile::write(os,(int)puVar2,puVar3 + -(long)puVar2,in_RCX);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}